

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

void png_handle_pCAL(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  png_bytep buf_00;
  png_bytep ppVar4;
  png_bytep units_00;
  png_charpp params_00;
  bool bVar5;
  png_int_32 local_5c;
  png_int_32 local_58;
  int local_54;
  int i;
  png_charpp params;
  png_bytep endptr;
  png_bytep units;
  png_bytep buf;
  png_bytep buffer;
  png_byte nparams;
  png_byte type;
  png_int_32 X1;
  png_int_32 X0;
  png_uint_32 length_local;
  png_inforp info_ptr_local;
  png_structrp png_ptr_local;
  
  if ((png_ptr->mode & 1) == 0) {
    png_chunk_error(png_ptr,"missing IHDR");
  }
  if ((png_ptr->mode & 4) == 0) {
    if ((info_ptr == (png_inforp)0x0) || ((info_ptr->valid & 0x400) == 0)) {
      buf_00 = png_read_buffer(png_ptr,(ulong)(length + 1),2);
      if (buf_00 == (png_bytep)0x0) {
        png_crc_finish(png_ptr,length);
        png_chunk_benign_error(png_ptr,"out of memory");
      }
      else {
        png_crc_read(png_ptr,buf_00,length);
        iVar3 = png_crc_finish(png_ptr,0);
        if (iVar3 == 0) {
          buf_00[length] = '\0';
          for (units = buf_00; *units != '\0'; units = units + 1) {
          }
          ppVar4 = buf_00 + length;
          if ((long)ppVar4 - (long)units < 0xd) {
            png_chunk_benign_error(png_ptr,"invalid");
          }
          else {
            if ((units[1] & 0x80) == 0) {
              local_58 = (uint)units[1] * 0x1000000 + (uint)units[2] * 0x10000 +
                         (uint)units[3] * 0x100 + (uint)units[4];
            }
            else {
              local_58 = -(((uint)units[1] * 0x1000000 + (uint)units[2] * 0x10000 +
                            (uint)units[3] * 0x100 + (uint)units[4] ^ 0xffffffff) + 1 & 0x7fffffff);
            }
            if ((units[5] & 0x80) == 0) {
              local_5c = (uint)units[5] * 0x1000000 + (uint)units[6] * 0x10000 +
                         (uint)units[7] * 0x100 + (uint)units[8];
            }
            else {
              local_5c = -(((uint)units[5] * 0x1000000 + (uint)units[6] * 0x10000 +
                            (uint)units[7] * 0x100 + (uint)units[8] ^ 0xffffffff) + 1 & 0x7fffffff);
            }
            bVar1 = units[9];
            bVar2 = units[10];
            units_00 = units + 0xb;
            if (((((bVar1 == 0) && (bVar2 != 2)) || ((bVar1 == 1 && (bVar2 != 3)))) ||
                ((bVar1 == 2 && (bVar2 != 3)))) || ((bVar1 == 3 && (bVar2 != 4)))) {
              png_chunk_benign_error(png_ptr,"invalid parameter count");
            }
            else {
              units = units_00;
              if (3 < bVar1) {
                png_chunk_benign_error(png_ptr,"unrecognized equation type");
              }
              for (; *units != '\0'; units = units + 1) {
              }
              params_00 = (png_charpp)png_malloc_warn(png_ptr,(ulong)bVar2 << 3);
              if (params_00 == (png_charpp)0x0) {
                png_chunk_benign_error(png_ptr,"out of memory");
              }
              else {
                for (local_54 = 0; local_54 < (int)(uint)bVar2; local_54 = local_54 + 1) {
                  units = units + 1;
                  params_00[local_54] = (char *)units;
                  while( true ) {
                    bVar5 = false;
                    if (units <= ppVar4) {
                      bVar5 = *units != '\0';
                    }
                    if (!bVar5) break;
                    units = units + 1;
                  }
                  if (ppVar4 < units) {
                    png_free(png_ptr,params_00);
                    png_chunk_benign_error(png_ptr,"invalid data");
                    return;
                  }
                }
                png_set_pCAL(png_ptr,info_ptr,(png_const_charp)buf_00,local_58,local_5c,(uint)bVar1,
                             (uint)bVar2,(png_const_charp)units_00,params_00);
                png_free(png_ptr,params_00);
              }
            }
          }
        }
      }
    }
    else {
      png_crc_finish(png_ptr,length);
      png_chunk_benign_error(png_ptr,"duplicate");
    }
  }
  else {
    png_crc_finish(png_ptr,length);
    png_chunk_benign_error(png_ptr,"out of place");
  }
  return;
}

Assistant:

void /* PRIVATE */
png_handle_pCAL(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   png_int_32 X0, X1;
   png_byte type, nparams;
   png_bytep buffer, buf, units, endptr;
   png_charpp params;
   int i;

   png_debug(1, "in png_handle_pCAL");

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   else if ((png_ptr->mode & PNG_HAVE_IDAT) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of place");
      return;
   }

   else if (info_ptr != NULL && (info_ptr->valid & PNG_INFO_pCAL) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "duplicate");
      return;
   }

   png_debug1(2, "Allocating and reading pCAL chunk data (%u bytes)",
       length + 1);

   buffer = png_read_buffer(png_ptr, length+1, 2/*silent*/);

   if (buffer == NULL)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of memory");
      return;
   }

   png_crc_read(png_ptr, buffer, length);

   if (png_crc_finish(png_ptr, 0) != 0)
      return;

   buffer[length] = 0; /* Null terminate the last string */

   png_debug(3, "Finding end of pCAL purpose string");
   for (buf = buffer; *buf; buf++)
      /* Empty loop */ ;

   endptr = buffer + length;

   /* We need to have at least 12 bytes after the purpose string
    * in order to get the parameter information.
    */
   if (endptr - buf <= 12)
   {
      png_chunk_benign_error(png_ptr, "invalid");
      return;
   }

   png_debug(3, "Reading pCAL X0, X1, type, nparams, and units");
   X0 = png_get_int_32((png_bytep)buf+1);
   X1 = png_get_int_32((png_bytep)buf+5);
   type = buf[9];
   nparams = buf[10];
   units = buf + 11;

   png_debug(3, "Checking pCAL equation type and number of parameters");
   /* Check that we have the right number of parameters for known
    * equation types.
    */
   if ((type == PNG_EQUATION_LINEAR && nparams != 2) ||
       (type == PNG_EQUATION_BASE_E && nparams != 3) ||
       (type == PNG_EQUATION_ARBITRARY && nparams != 3) ||
       (type == PNG_EQUATION_HYPERBOLIC && nparams != 4))
   {
      png_chunk_benign_error(png_ptr, "invalid parameter count");
      return;
   }

   else if (type >= PNG_EQUATION_LAST)
   {
      png_chunk_benign_error(png_ptr, "unrecognized equation type");
   }

   for (buf = units; *buf; buf++)
      /* Empty loop to move past the units string. */ ;

   png_debug(3, "Allocating pCAL parameters array");

   params = png_voidcast(png_charpp, png_malloc_warn(png_ptr,
       nparams * (sizeof (png_charp))));

   if (params == NULL)
   {
      png_chunk_benign_error(png_ptr, "out of memory");
      return;
   }

   /* Get pointers to the start of each parameter string. */
   for (i = 0; i < nparams; i++)
   {
      buf++; /* Skip the null string terminator from previous parameter. */

      png_debug1(3, "Reading pCAL parameter %d", i);

      for (params[i] = (png_charp)buf; buf <= endptr && *buf != 0; buf++)
         /* Empty loop to move past each parameter string */ ;

      /* Make sure we haven't run out of data yet */
      if (buf > endptr)
      {
         png_free(png_ptr, params);
         png_chunk_benign_error(png_ptr, "invalid data");
         return;
      }
   }

   png_set_pCAL(png_ptr, info_ptr, (png_charp)buffer, X0, X1, type, nparams,
       (png_charp)units, params);

   png_free(png_ptr, params);
}